

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ewmh.c
# Opt level: O0

xcb_ewmh_connection_t * ewmh_create(xcb_connection_t *xcb_connection)

{
  char cVar1;
  undefined8 uVar2;
  xcb_intern_atom_cookie_t *cookie;
  xcb_ewmh_connection_t *ewmh_connection;
  xcb_connection_t *xcb_connection_local;
  
  xcb_connection_local = (xcb_connection_t *)malloc(0x168);
  if (xcb_connection_local == (xcb_connection_t *)0x0) {
    xcb_connection_local = (xcb_connection_t *)0x0;
  }
  else {
    uVar2 = xcb_ewmh_init_atoms(xcb_connection,xcb_connection_local);
    cVar1 = xcb_ewmh_init_atoms_replies(xcb_connection_local,uVar2,0);
    if (cVar1 == '\0') {
      free(xcb_connection_local);
      xcb_connection_local = (xcb_connection_t *)0x0;
    }
  }
  return (xcb_ewmh_connection_t *)xcb_connection_local;
}

Assistant:

xcb_ewmh_connection_t *ewmh_create(xcb_connection_t *xcb_connection)
{
        xcb_ewmh_connection_t *ewmh_connection = malloc(sizeof(xcb_ewmh_connection_t));

        if (ewmh_connection == NULL) {
                return NULL;
        }

        xcb_intern_atom_cookie_t *cookie = xcb_ewmh_init_atoms(xcb_connection, ewmh_connection);

        if (xcb_ewmh_init_atoms_replies(ewmh_connection, cookie, NULL) == 0) {
                // Failed to init ewmh
                free(ewmh_connection);

                return NULL;
        }

        return ewmh_connection;
}